

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

int Ssw_ManSweepNode(Ssw_Man_t *p,Aig_Obj_t *pObj,int f,int fBmc,Vec_Int_t *vPairs)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  abctime aVar8;
  abctime aVar9;
  abctime clk;
  int RetValue;
  Aig_Obj_t *pObjReprFraig;
  Aig_Obj_t *pObjFraig2;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObjRepr;
  Vec_Int_t *vPairs_local;
  int fBmc_local;
  int f_local;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  pObj_00 = Aig_ObjRepr(p->pAig,pObj);
  if (pObj_00 == (Aig_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    pAVar5 = Ssw_ObjFrame(p,pObj,f);
    pObj_01 = Ssw_ObjFrame(p,pObj_00,f);
    if ((pAVar5 == (Aig_Obj_t *)0x0) || (pObj_01 == (Aig_Obj_t *)0x0)) {
      __assert_fail("pObjFraig != NULL && pObjReprFraig != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSweep.c"
                    ,0xc9,"int Ssw_ManSweepNode(Ssw_Man_t *, Aig_Obj_t *, int, int, Vec_Int_t *)");
    }
    uVar1 = *(ulong *)&pObj->field_0x18;
    uVar2 = *(ulong *)&pObj_00->field_0x18;
    iVar3 = Aig_ObjPhaseReal(pAVar5);
    iVar4 = Aig_ObjPhaseReal(pObj_01);
    if ((((uint)(uVar1 >> 3) & 1) == ((uint)(uVar2 >> 3) & 1)) != (iVar3 == iVar4)) {
      __assert_fail("(pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSweep.c"
                    ,0xca,"int Ssw_ManSweepNode(Ssw_Man_t *, Aig_Obj_t *, int, int, Vec_Int_t *)");
    }
    pAVar6 = Aig_Regular(pAVar5);
    pAVar7 = Aig_Regular(pObj_01);
    if (pAVar6 == pAVar7) {
      p_local._4_4_ = 0;
    }
    else {
      if ((fBmc == 0) && (p->pPars->fDynamic != 0)) {
        aVar8 = Abc_Clock();
        Ssw_ManLoadSolver(p,pObj_00,pObj);
        p->nRecycleCalls = p->nRecycleCalls + 1;
        aVar9 = Abc_Clock();
        p->timeMarkCones = (aVar9 - aVar8) + p->timeMarkCones;
      }
      pAVar6 = Aig_Regular(pAVar5);
      pAVar7 = Aig_ManConst1(p->pFrames);
      if (pAVar6 == pAVar7) {
        pAVar5 = Aig_Regular(pAVar5);
        pAVar6 = Aig_Regular(pObj_01);
        clk._4_4_ = Ssw_NodesAreEquiv(p,pAVar5,pAVar6);
      }
      else {
        pAVar6 = Aig_Regular(pObj_01);
        pAVar5 = Aig_Regular(pAVar5);
        clk._4_4_ = Ssw_NodesAreEquiv(p,pAVar6,pAVar5);
      }
      if (clk._4_4_ == 1) {
        pAVar5 = Aig_NotCond(pObj_01,(uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                                     (uint)(*(ulong *)&pObj_00->field_0x18 >> 3) & 1);
        Ssw_ObjSetFrame(p,pObj,f,pAVar5);
        if ((p->pPars->fEquivDump2 != 0) && (vPairs != (Vec_Int_t *)0x0)) {
          Vec_IntPush(vPairs,pObj_00->Id);
          Vec_IntPush(vPairs,pObj->Id);
        }
        p_local._4_4_ = 0;
      }
      else {
        if ((p->pPars->fEquivDump != 0) && (vPairs != (Vec_Int_t *)0x0)) {
          Vec_IntPush(vPairs,pObj_00->Id);
          Vec_IntPush(vPairs,pObj->Id);
        }
        if (clk._4_4_ == -1) {
          Ssw_ClassesRemoveNode(p->ppClasses,pObj);
          p_local._4_4_ = 1;
        }
        else if ((fBmc == 0) && (p->pPars->fDynamic != 0)) {
          Ssw_SmlAddPatternDyn(p);
          p->nPatterns = p->nPatterns + 1;
          p_local._4_4_ = 1;
        }
        else {
          Ssw_SmlSavePatternAig(p,f);
          if (p->pPars->fConstrs == 0) {
            Ssw_ManResimulateWord(p,pObj,pObj_00,f);
          }
          else {
            Ssw_ManResimulateBit(p,pObj,pObj_00);
          }
          pAVar5 = Aig_ObjRepr(p->pAig,pObj);
          if (pAVar5 == pObj_00) {
            __assert_fail("Aig_ObjRepr( p->pAig, pObj ) != pObjRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSweep.c"
                          ,0xfd,
                          "int Ssw_ManSweepNode(Ssw_Man_t *, Aig_Obj_t *, int, int, Vec_Int_t *)");
          }
          pAVar5 = Aig_ObjRepr(p->pAig,pObj);
          if (pAVar5 == pObj_00) {
            Abc_Print(1,"Ssw_ManSweepNode(): Failed to refine representative.\n");
          }
          p_local._4_4_ = 1;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Ssw_ManSweepNode( Ssw_Man_t * p, Aig_Obj_t * pObj, int f, int fBmc, Vec_Int_t * vPairs )
{
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    abctime clk;
    // get representative of this class
    pObjRepr = Aig_ObjRepr( p->pAig, pObj );
    if ( pObjRepr == NULL )
        return 0;
    // get the fraiged node
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    // get the fraiged representative
    pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, f );
    // check if constant 0 pattern distinquishes these nodes
    assert( pObjFraig != NULL && pObjReprFraig != NULL );
    assert( (pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return 0;
    // add constraints on demand
    if ( !fBmc && p->pPars->fDynamic )
    {
clk = Abc_Clock();
        Ssw_ManLoadSolver( p, pObjRepr, pObj );
        p->nRecycleCalls++;
p->timeMarkCones += Abc_Clock() - clk;
    }
    // call equivalence checking
    if ( Aig_Regular(pObjFraig) != Aig_ManConst1(p->pFrames) )
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    else
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Ssw_ObjSetFrame( p, pObj, f, pObjFraig2 );
        if ( p->pPars->fEquivDump2 && vPairs )
        {
            Vec_IntPush( vPairs, pObjRepr->Id );
            Vec_IntPush( vPairs, pObj->Id );
        }
        return 0;
    }
    if ( p->pPars->fEquivDump && vPairs )
    {
        Vec_IntPush( vPairs, pObjRepr->Id );
        Vec_IntPush( vPairs, pObj->Id );
    }
    if ( RetValue == -1 ) // timed out
    {
        Ssw_ClassesRemoveNode( p->ppClasses, pObj );
        return 1;
    }
    // disproved the equivalence
    if ( !fBmc && p->pPars->fDynamic )
    {
        Ssw_SmlAddPatternDyn( p );
        p->nPatterns++;
        return 1;
    }
    else
        Ssw_SmlSavePatternAig( p, f );
    if ( !p->pPars->fConstrs )
        Ssw_ManResimulateWord( p, pObj, pObjRepr, f );
    else
        Ssw_ManResimulateBit( p, pObj, pObjRepr );
    assert( Aig_ObjRepr( p->pAig, pObj ) != pObjRepr );
    if ( Aig_ObjRepr( p->pAig, pObj ) == pObjRepr )
    {
        Abc_Print( 1, "Ssw_ManSweepNode(): Failed to refine representative.\n" );
    }
    return 1;
}